

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ast.cpp
# Opt level: O2

Parse_ast * __thiscall
lambda::parse_from::helper::parse_term(Parse_ast *__return_storage_ptr__,helper *this)

{
  optional<lambda::Parse_ast> tm;
  _Optional_payload_base<lambda::Parse_ast> local_50;
  
  maybe_parse_term((optional<lambda::Parse_ast> *)&local_50,this);
  if (local_50._M_engaged == true) {
    std::__detail::__variant::
    _Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
    ::_Move_ctor_base((_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                       *)__return_storage_ptr__,
                      (_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                       *)&local_50);
    std::_Optional_payload_base<lambda::Parse_ast>::_M_reset(&local_50);
    return __return_storage_ptr__;
  }
  unexpected_thing(this);
}

Assistant:

Parse_ast parse_term() {
      if (auto tm = maybe_parse_term()) {
        return std::move(*tm);
      } else {
        unexpected_thing();
      }
    }